

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  Column *__return_storage_ptr__;
  pointer pRVar1;
  size_type sVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  Column *pCVar6;
  Column *other;
  pointer pRVar7;
  size_t newWidth;
  pointer text;
  Column local_d8;
  Column local_a0;
  Columns local_68 [2];
  
  std::operator<<(out,"Available reporters:\n");
  text = (descriptions->
         super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar7 = text;
  pRVar5 = text;
  pRVar3 = text;
  if (text != pRVar1) {
    while (pRVar5 = pRVar7, pRVar7 = pRVar3 + 1, pRVar7 != pRVar1) {
      pRVar4 = pRVar3 + 1;
      pRVar3 = pRVar7;
      if ((pRVar4->name)._M_string_length <= (pRVar5->name)._M_string_length) {
        pRVar7 = pRVar5;
      }
    }
  }
  sVar2 = (pRVar5->name)._M_string_length;
  newWidth = sVar2 + 5;
  __return_storage_ptr__ = (Column *)(local_68 + 1);
  for (; text != pRVar1; text = text + 1) {
    if (verbosity == Quiet) {
      TextFlow::Column::Column(&local_d8,&text->name);
      local_d8.m_indent = 2;
      pCVar6 = TextFlow::Column::width(&local_d8,newWidth);
      TextFlow::operator<<(out,pCVar6);
      std::operator<<(out,'\n');
      pCVar6 = &local_d8;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&text->name,':');
      TextFlow::Column::Column(&local_d8,(string *)__return_storage_ptr__);
      local_d8.m_indent = 2;
      pCVar6 = TextFlow::Column::width(&local_d8,newWidth);
      TextFlow::Column::Column(&local_a0,&text->description);
      local_a0.m_initialIndent = 0;
      local_a0.m_indent = 2;
      other = TextFlow::Column::width(&local_a0,0x48 - sVar2);
      TextFlow::Column::operator+(local_68,pCVar6,other);
      TextFlow::operator<<(out,local_68);
      std::operator<<(out,'\n');
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_68[0].m_columns);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_d8);
      pCVar6 = __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)pCVar6);
  }
  std::operator<<(out,'\n');
  std::ostream::flush();
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }